

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTUtilities.h
# Opt level: O1

pool_ptr<soul::AST::ProcessorBase> __thiscall
soul::ASTUtilities::scanForProcessorToUseAsMain(ASTUtilities *this,ModuleBase *module)

{
  int iVar1;
  long in_RAX;
  undefined4 extraout_var;
  long lVar3;
  Property *pPVar4;
  long *extraout_RDX;
  pool_ptr<soul::AST::ProcessorBase> p2;
  long local_38;
  long *plVar2;
  
  *(undefined8 *)this = 0;
  local_38 = in_RAX;
  iVar1 = (*(module->super_Scope)._vptr_Scope[0x11])(&module->super_Scope);
  for (plVar2 = (long *)CONCAT44(extraout_var,iVar1); plVar2 != extraout_RDX; plVar2 = plVar2 + 1) {
    if (*plVar2 == 0) {
      lVar3 = 0;
    }
    else {
      lVar3 = __dynamic_cast(*plVar2,&AST::ModuleBase::typeinfo,&AST::ProcessorBase::typeinfo,0);
    }
    if (((lVar3 == 0) || (*(long *)(lVar3 + 0x120) != 0)) ||
       (pPVar4 = AST::Annotation::findProperty<char[5]>
                           ((Annotation *)(lVar3 + 0x108),(char (*) [5])"main"),
       pPVar4 != (Property *)0x0)) {
      scanForProcessorToUseAsMain((ASTUtilities *)&local_38,(ModuleBase *)*plVar2);
      if (local_38 != 0) {
        *(long *)this = local_38;
      }
    }
    else {
      *(long *)this = lVar3;
    }
  }
  return (pool_ptr<soul::AST::ProcessorBase>)(ProcessorBase *)this;
}

Assistant:

static pool_ptr<AST::ProcessorBase> scanForProcessorToUseAsMain (AST::ModuleBase& module)
    {
        pool_ptr<AST::ProcessorBase> lastProcessor;

        for (auto& m : module.getSubModules())
        {
            auto p1 = cast<AST::ProcessorBase> (m);

            if (p1 != nullptr && ! p1->isSpecialisedInstance() && p1->annotation.findProperty ("main") == nullptr)
                lastProcessor = p1;
            else if (auto p2 = scanForProcessorToUseAsMain (m))
                lastProcessor = p2;
        }

        return lastProcessor;
    }